

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfFast.c
# Opt level: O0

word Cnf_CutDeriveTruth(Aig_Man_t *p,Vec_Ptr_t *vLeaves,Vec_Ptr_t *vNodes)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  Aig_Obj_t *pAVar6;
  int local_2c;
  Aig_Obj_t *pAStack_28;
  int i;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vNodes_local;
  Vec_Ptr_t *vLeaves_local;
  Aig_Man_t *p_local;
  
  pAStack_28 = (Aig_Obj_t *)0x0;
  iVar4 = Vec_PtrSize(vLeaves);
  if ((iVar4 < 7) && (iVar4 = Vec_PtrSize(vNodes), 0 < iVar4)) {
    iVar4 = Vec_PtrSize(vLeaves);
    iVar5 = Vec_PtrSize(vNodes);
    if (0x100 < iVar4 + iVar5) {
      __assert_fail("Vec_PtrSize(vLeaves) + Vec_PtrSize(vNodes) <= 256",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/cnf/cnfFast.c"
                    ,0x99,"word Cnf_CutDeriveTruth(Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
    }
    for (local_2c = 0; iVar4 = Vec_PtrSize(vLeaves), local_2c < iVar4; local_2c = local_2c + 1) {
      pAStack_28 = (Aig_Obj_t *)Vec_PtrEntry(vLeaves,local_2c);
      (pAStack_28->field_5).iData = local_2c;
      Cnf_CutDeriveTruth::S[(pAStack_28->field_5).iData] = Cnf_CutDeriveTruth::Truth6[local_2c];
    }
    for (local_2c = 0; iVar4 = Vec_PtrSize(vNodes), local_2c < iVar4; local_2c = local_2c + 1) {
      pAStack_28 = (Aig_Obj_t *)Vec_PtrEntry(vNodes,local_2c);
      iVar4 = Vec_PtrSize(vLeaves);
      (pAStack_28->field_5).iData = iVar4 + local_2c;
      pAVar6 = Aig_ObjFanin0(pAStack_28);
      uVar1 = Cnf_CutDeriveTruth::S[(pAVar6->field_5).iData];
      iVar4 = Aig_ObjFaninC0(pAStack_28);
      uVar2 = Cnf_CutDeriveTruth::C[iVar4];
      pAVar6 = Aig_ObjFanin1(pAStack_28);
      uVar3 = Cnf_CutDeriveTruth::S[(pAVar6->field_5).iData];
      iVar4 = Aig_ObjFaninC1(pAStack_28);
      Cnf_CutDeriveTruth::S[(pAStack_28->field_5).iData] =
           (uVar1 ^ uVar2) & (uVar3 ^ Cnf_CutDeriveTruth::C[iVar4]);
    }
    return Cnf_CutDeriveTruth::S[(pAStack_28->field_5).iData];
  }
  __assert_fail("Vec_PtrSize(vLeaves) <= 6 && Vec_PtrSize(vNodes) > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/cnf/cnfFast.c"
                ,0x98,"word Cnf_CutDeriveTruth(Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
}

Assistant:

word Cnf_CutDeriveTruth( Aig_Man_t * p, Vec_Ptr_t * vLeaves, Vec_Ptr_t * vNodes )
{
    static word Truth6[6] = {
        ABC_CONST(0xAAAAAAAAAAAAAAAA),
        ABC_CONST(0xCCCCCCCCCCCCCCCC),
        ABC_CONST(0xF0F0F0F0F0F0F0F0),
        ABC_CONST(0xFF00FF00FF00FF00),
        ABC_CONST(0xFFFF0000FFFF0000),
        ABC_CONST(0xFFFFFFFF00000000)
    };
    static word C[2] = { 0, ~(word)0 };
    static word S[256];
    Aig_Obj_t * pObj = NULL;
    int i;
    assert( Vec_PtrSize(vLeaves) <= 6 && Vec_PtrSize(vNodes) > 0 );
    assert( Vec_PtrSize(vLeaves) + Vec_PtrSize(vNodes) <= 256 );
    Vec_PtrForEachEntry( Aig_Obj_t *, vLeaves, pObj, i )
    {
        pObj->iData    = i;
        S[pObj->iData] = Truth6[i];
    }
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
    {
        pObj->iData    = Vec_PtrSize(vLeaves) + i;
        S[pObj->iData] = (S[Aig_ObjFanin0(pObj)->iData] ^ C[Aig_ObjFaninC0(pObj)]) & 
                         (S[Aig_ObjFanin1(pObj)->iData] ^ C[Aig_ObjFaninC1(pObj)]);
    }
    return S[pObj->iData];
}